

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10310e3::BlendA64Mask1DTest8B::Execute
          (BlendA64Mask1DTest8B *this,uint8_t *p_src0,uint8_t *p_src1)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  RegisterStateCheckMMX local_46;
  long local_28;
  long local_20;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  (**(code **)(in_RDI + 0x20))
            (in_RDI + 0x38 + (ulong)*(uint *)(in_RDI + 0x2803c),*(undefined4 *)(in_RDI + 0x28038),
             in_RSI + (ulong)*(uint *)(in_RDI + 0x3c044),*(undefined4 *)(in_RDI + 0x3c040),
             in_RDX + (ulong)*(uint *)(in_RDI + 0x5004c),*(undefined4 *)(in_RDI + 0x50048),
             in_RDI + 0x50050,*(undefined4 *)(in_RDI + 0x50150),*(undefined4 *)(in_RDI + 0x50154));
  libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_46);
  (**(code **)(in_RDI + 0x28))
            (in_RDI + 0x14038 + (ulong)*(uint *)(in_RDI + 0x2803c),*(undefined4 *)(in_RDI + 0x28038)
             ,local_20 + (ulong)*(uint *)(in_RDI + 0x3c044),*(undefined4 *)(in_RDI + 0x3c040),
             local_28 + (ulong)*(uint *)(in_RDI + 0x5004c),*(undefined4 *)(in_RDI + 0x50048),
             in_RDI + 0x50050,*(undefined4 *)(in_RDI + 0x50150),*(undefined4 *)(in_RDI + 0x50154));
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xa77da8);
  return;
}

Assistant:

void Execute(const uint8_t *p_src0, const uint8_t *p_src1) override {
    params_.ref_func(dst_ref_ + dst_offset_, dst_stride_, p_src0 + src0_offset_,
                     src0_stride_, p_src1 + src1_offset_, src1_stride_, mask_,
                     w_, h_);
    API_REGISTER_STATE_CHECK(params_.tst_func(
        dst_tst_ + dst_offset_, dst_stride_, p_src0 + src0_offset_,
        src0_stride_, p_src1 + src1_offset_, src1_stride_, mask_, w_, h_));
  }